

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

shared_ptr<evp_pkey_st> __thiscall
jwt::helper::load_public_key_from_string(helper *this,string *key,string *password)

{
  int iVar1;
  int iVar2;
  BIO_METHOD *type;
  BIO *b;
  runtime_error *prVar3;
  EVP_PKEY *pEVar4;
  ulong e;
  char *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<evp_pkey_st> sVar6;
  string epkey;
  allocator<char> local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  type = BIO_s_mem();
  b = BIO_new(type);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)key);
  iVar1 = std::__cxx11::string::compare((char *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == 0) {
    extract_pubkey_from_cert(&local_70,key,password);
    iVar1 = BIO_write(b,local_70._M_dataplus._M_p,(int)local_70._M_string_length);
    if (iVar1 != (int)local_70._M_string_length) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"failed to load public key: bio_write failed");
      *(undefined ***)prVar3 = &PTR__runtime_error_00113bd8;
      __cxa_throw(prVar3,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar1 = (int)key->_M_string_length;
    iVar2 = BIO_write(b,(key->_M_dataplus)._M_p,iVar1);
    if (iVar2 != iVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"failed to load public key: bio_write failed");
      *(undefined ***)prVar3 = &PTR__runtime_error_00113bd8;
      __cxa_throw(prVar3,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pEVar4 = PEM_read_bio_PUBKEY(b,(EVP_PKEY **)0x0,(undefined1 *)0x0,(password->_M_dataplus)._M_p);
  *(EVP_PKEY **)this = pEVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<evp_pkey_st*,void(*)(evp_pkey_st*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),pEVar4,EVP_PKEY_free);
  if (*(long *)this != 0) {
    _Var5._M_pi = extraout_RDX;
    if (b != (BIO *)0x0) {
      BIO_free_all(b);
      _Var5._M_pi = extraout_RDX_00;
    }
    sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<evp_pkey_st>)
           sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  e = ERR_get_error();
  __s = ERR_error_string(e,(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
  std::operator+(&local_70,"failed to load public key: PEM_read_bio_PUBKEY failed:",&local_50);
  std::runtime_error::runtime_error(prVar3,(string *)&local_70);
  *(undefined ***)prVar3 = &PTR__runtime_error_00113bd8;
  __cxa_throw(prVar3,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
		std::shared_ptr<EVP_PKEY> load_public_key_from_string(const std::string& key, const std::string& password = "") {
			std::unique_ptr<BIO, decltype(&BIO_free_all)> pubkey_bio(BIO_new(BIO_s_mem()), BIO_free_all);
			if(key.substr(0, 27) == "-----BEGIN CERTIFICATE-----") {
				auto epkey = helper::extract_pubkey_from_cert(key, password);
				const int len = static_cast<int>(epkey.size());
				if (BIO_write(pubkey_bio.get(), epkey.data(), len) != len)
					throw rsa_exception("failed to load public key: bio_write failed");
			} else {
				const int len = static_cast<int>(key.size());
				if (BIO_write(pubkey_bio.get(), key.data(), len) != len)
					throw rsa_exception("failed to load public key: bio_write failed");
			}
			
			std::shared_ptr<EVP_PKEY> pkey(PEM_read_bio_PUBKEY(pubkey_bio.get(), nullptr, nullptr, (void*)password.c_str()), EVP_PKEY_free);
			if (!pkey)
				throw rsa_exception("failed to load public key: PEM_read_bio_PUBKEY failed:" + std::string(ERR_error_string(ERR_get_error(), NULL)));
			return pkey;
		}